

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O0

void __thiscall
Memory::HeapInfo::SweepPartialReusePages(HeapInfo *this,RecyclerSweep *recyclerSweep)

{
  bool bVar1;
  RecyclerSweepManager *pRVar2;
  size_t sVar3;
  Recycler *pRVar4;
  uint local_20;
  uint local_1c;
  uint i_1;
  uint i;
  RecyclerSweep *recyclerSweep_local;
  HeapInfo *this_local;
  
  for (local_1c = 0; local_1c < 0x30; local_1c = local_1c + 1) {
    HeapBucketGroup<SmallAllocationBlockAttributes>::SweepPartialReusePages
              (this->heapBuckets + local_1c,recyclerSweep);
  }
  for (local_20 = 0; local_20 < 0x1d; local_20 = local_20 + 1) {
    HeapBucketGroup<MediumAllocationBlockAttributes>::SweepPartialReusePages
              (this->mediumHeapBuckets + local_20,recyclerSweep);
  }
  pRVar2 = RecyclerSweep::GetManager(recyclerSweep);
  bVar1 = RecyclerSweepManager::InPartialCollect(pRVar2);
  if (bVar1) {
    pRVar2 = RecyclerSweep::GetManager(recyclerSweep);
    sVar3 = RecyclerSweepManager::GetPartialUnusedFreeByteCount(pRVar2);
    pRVar4 = RecyclerSweep::GetRecycler(recyclerSweep);
    (pRVar4->autoHeap).unusedPartialCollectFreeBytes =
         sVar3 + (pRVar4->autoHeap).unusedPartialCollectFreeBytes;
  }
  return;
}

Assistant:

void
HeapInfo::SweepPartialReusePages(RecyclerSweep& recyclerSweep)
{
    RECYCLER_PROFILE_EXEC_THREAD_BEGIN(recyclerSweep.IsBackground(), recyclerSweep.GetRecycler(), Js::SweepPartialReusePhase);

    for (uint i = 0; i < HeapConstants::BucketCount; i++)
    {
        heapBuckets[i].SweepPartialReusePages(recyclerSweep);
    }

#if defined(BUCKETIZE_MEDIUM_ALLOCATIONS) && SMALLBLOCK_MEDIUM_ALLOC
    for (uint i = 0; i < HeapConstants::MediumBucketCount; i++)
    {
        mediumHeapBuckets[i].SweepPartialReusePages(recyclerSweep);
    }
#endif

    RECYCLER_PROFILE_EXEC_THREAD_END(recyclerSweep.IsBackground(), recyclerSweep.GetRecycler(), Js::SweepPartialReusePhase);

    // GC-TODO: LargeHeapBlock don't reuse object, so we don't need to keep
    // pages with low free space from being reused.

    // Only count the byte that we would have freed but we are not reusing it if we are doing a partial GC
    // This will increase the GC pressure and make partial less and less likely.
    if (recyclerSweep.GetManager()->InPartialCollect())
    {
        recyclerSweep.GetRecycler()->autoHeap.unusedPartialCollectFreeBytes += recyclerSweep.GetManager()->GetPartialUnusedFreeByteCount();
    }
}